

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O0

GLboolean glxewGetExtension(char *name)

{
  Display *pDVar1;
  GLubyte *s;
  GLubyte *in_RDI;
  GLubyte *end;
  GLubyte *start;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  GLboolean GVar2;
  
  if (__glewXGetCurrentDisplay == (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
    GVar2 = '\0';
  }
  else {
    pDVar1 = (*__glewXGetCurrentDisplay)();
    s = (GLubyte *)glXGetClientString(pDVar1,3);
    if (s == (GLubyte *)0x0) {
      GVar2 = '\0';
    }
    else {
      _glewStrLen(s);
      GVar2 = _glewSearchExtension
                        ((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         in_RDI,s);
    }
  }
  return GVar2;
}

Assistant:

GLboolean glxewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;

  if (glXGetCurrentDisplay == NULL) return GL_FALSE;
  start = (const GLubyte*)glXGetClientString(glXGetCurrentDisplay(), GLX_EXTENSIONS);
  if (0 == start) return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}